

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_D3D_DCL(Context *ctx)

{
  RegisterType RVar1;
  uint uVar2;
  size_t in_RDX;
  char *pcVar3;
  char index_str [16];
  char dst [64];
  char local_68 [88];
  
  make_D3D_destarg_string(ctx,local_68 + 0x10,in_RDX);
  local_68[0] = '\0';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_68[8] = '\0';
  local_68[9] = '\0';
  local_68[10] = '\0';
  local_68[0xb] = '\0';
  local_68[0xc] = '\0';
  local_68[0xd] = '\0';
  local_68[0xe] = '\0';
  local_68[0xf] = '\0';
  RVar1 = (ctx->dest_arg).regtype;
  if (RVar1 == REG_TYPE_MISCTYPE) {
    if (1 < (uint)(ctx->dest_arg).regnum) {
      pcVar3 = "unknown misc register type";
LAB_00111db7:
      failf(ctx,"%s",pcVar3);
      return;
    }
    pcVar3 = "";
  }
  else if (RVar1 == REG_TYPE_SAMPLER) {
    uVar2 = ctx->dwords[0] - 2;
    if (2 < uVar2) {
      pcVar3 = "unknown sampler texture type";
      goto LAB_00111db7;
    }
    pcVar3 = &DAT_001203b0 + *(int *)(&DAT_001203b0 + (ulong)uVar2 * 4);
  }
  else {
    pcVar3 = usagestrs[ctx->dwords[0]];
    if (ctx->dwords[1] != 0) {
      snprintf(local_68,0x10,"%u");
    }
  }
  output_line(ctx,"dcl%s%s%s",pcVar3,local_68,local_68 + 0x10);
  return;
}

Assistant:

static void emit_D3D_DCL(Context *ctx)
{
    char dst[64];
    make_D3D_destarg_string(ctx, dst, sizeof (dst));
    const DestArgInfo *arg = &ctx->dest_arg;
    const char *usage_str = "";
    char index_str[16] = { '\0' };

    if (arg->regtype == REG_TYPE_SAMPLER)
    {
        switch ((const TextureType) ctx->dwords[0])
        {
            case TEXTURE_TYPE_2D: usage_str = "_2d"; break;
            case TEXTURE_TYPE_CUBE: usage_str = "_cube"; break;
            case TEXTURE_TYPE_VOLUME: usage_str = "_volume"; break;
            default: fail(ctx, "unknown sampler texture type"); return;
        } // switch
    } // if

    else if (arg->regtype == REG_TYPE_MISCTYPE)
    {
        switch ((const MiscTypeType) arg->regnum)
        {
            case MISCTYPE_TYPE_POSITION:
            case MISCTYPE_TYPE_FACE:
                usage_str = "";  // just become "dcl vFace" or whatever.
                break;
            default: fail(ctx, "unknown misc register type"); return;
        } // switch
    } // else if

    else
    {
        const uint32 usage = ctx->dwords[0];
        const uint32 index = ctx->dwords[1];
        usage_str = usagestrs[usage];
        if (index != 0)
            snprintf(index_str, sizeof (index_str), "%u", (uint) index);
    } // else

    output_line(ctx, "dcl%s%s%s", usage_str, index_str, dst);
}